

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_teleport_tree.hpp
# Opt level: O2

WorldTeleportTree * WorldTeleportTree::from_json(Json *json)

{
  uchar uVar1;
  unsigned_short tree_map_id;
  const_reference pvVar2;
  WorldTeleportTree *this;
  allocator<char> local_29d;
  uint16_t byte;
  allocator<char> local_299;
  key_type local_298;
  string node_id;
  key_type local_258;
  string byte_string;
  string name;
  string local_1f8;
  Flag local_1d8;
  string local_1c8;
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  uint auStack_180 [88];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"name",(allocator<char> *)&node_id);
  pvVar2 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,(key_type *)&ss);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&name,pvVar2);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"treeMapId",(allocator<char> *)&node_id);
  pvVar2 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,(key_type *)&ss);
  tree_map_id = nlohmann::
                basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get_impl<unsigned_short,_0>(pvVar2);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"nodeId",(allocator<char> *)&byte_string);
  pvVar2 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,(key_type *)&ss);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&node_id,pvVar2);
  std::__cxx11::string::~string((string *)&ss);
  byte = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"flag",(allocator<char> *)&local_258);
  pvVar2 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,(key_type *)&ss);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"byte",&local_29d);
  pvVar2 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(pvVar2,&local_298);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&byte_string,pvVar2);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  *(uint *)((long)auStack_180 + *(long *)(local_198._M_allocated_capacity - 0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198._M_allocated_capacity - 0x18)) & 0xffffffb5
       | 8;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_298,&byte_string,2,0xffffffffffffffff);
  std::operator<<((ostream *)local_198._M_local_buf,(string *)&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::istream::_M_extract<unsigned_short>((ushort *)&ss);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"flag",&local_29d);
  pvVar2 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_298);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"bit",&local_299);
  pvVar2 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(pvVar2,&local_258);
  uVar1 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<unsigned_char,_0>(pvVar2);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_298);
  this = (WorldTeleportTree *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_1f8,&name);
  std::__cxx11::string::string((string *)&local_1c8,&node_id);
  local_1d8._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_1d8.byte = byte;
  local_1d8.bit = uVar1;
  WorldTeleportTree(this,&local_1f8,tree_map_id,&local_1c8,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::__cxx11::string::~string((string *)&byte_string);
  std::__cxx11::string::~string((string *)&node_id);
  std::__cxx11::string::~string((string *)&name);
  return this;
}

Assistant:

static WorldTeleportTree* from_json(const Json& json)
    {
        std::string name = json.at("name");
        uint16_t tree_map_id = json.at("treeMapId");
        std::string node_id = json.at("nodeId");

        uint16_t byte = 0;
        std::string byte_string = json.at("flag").at("byte");
        std::stringstream ss;
        ss << std::hex << byte_string.substr(2);
        ss >> byte;
        uint8_t bit = json.at("flag").at("bit");

        return new WorldTeleportTree(name, tree_map_id, node_id, Flag(byte, bit));
    }